

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O0

wchar_t tty_stty(EditLine *el,wchar_t argc,wchar_t **argv)

{
  int iVar1;
  wchar_t wVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  bool bVar6;
  uchar local_4bc;
  int local_4a4;
  wchar_t v;
  wchar_t c;
  wchar_t *p;
  size_t cu;
  size_t st;
  size_t len;
  wchar_t i;
  wchar_t z;
  termios *tios;
  char name [1024];
  wchar_t *d;
  wchar_t *s;
  wchar_t aflag;
  char x;
  ttymodes_t *m;
  wchar_t **argv_local;
  wchar_t argc_local;
  EditLine *el_local;
  
  s._0_4_ = 0;
  _i = &(el->el_tty).t_ex;
  len._4_4_ = L'\0';
  if (argv == (wchar_t **)0x0) {
    return L'\xffffffff';
  }
  m = (ttymodes_t *)(argv + 1);
  pcVar3 = ct_encode_string(*argv,&el->el_scratch);
  strlcpy((char *)&tios,pcVar3,0x400);
  while( true ) {
    bVar6 = false;
    if (((m != (ttymodes_t *)0x0) && (bVar6 = false, m->m_name != (char *)0x0)) &&
       (bVar6 = false, *(int *)m->m_name == 0x2d)) {
      bVar6 = *(int *)(m->m_name + 8) == 0;
    }
    if (!bVar6) break;
    switch(*(undefined4 *)(m->m_name + 4)) {
    case 0x61:
      s._0_4_ = (int)s + 1;
      break;
    default:
      fprintf((FILE *)el->el_errfile,"%s: Unknown switch `%lc\'.\n",&tios,
              (ulong)*(uint *)(m->m_name + 4));
      return L'\xffffffff';
    case 100:
      _i = &(el->el_tty).t_ed;
      len._4_4_ = L'\x01';
      break;
    case 0x71:
      _i = &(el->el_tty).t_ts;
      len._4_4_ = L'\x02';
      break;
    case 0x78:
      _i = &(el->el_tty).t_ex;
      len._4_4_ = L'\0';
    }
    m = (ttymodes_t *)&m->m_value;
  }
  if ((m == (ttymodes_t *)0x0) || (m->m_name == (char *)0x0)) {
    len._0_4_ = -1;
    st = 0;
    cu = 0;
    for (_aflag = ttymodes; _aflag->m_name != (char *)0x0; _aflag = _aflag + 1) {
      if (_aflag->m_type != (int)len) {
        pcVar3 = "";
        if ((int)len != -1) {
          pcVar3 = "\n";
        }
        fprintf((FILE *)el->el_outfile,"%s%s",pcVar3,
                (el->el_tty).t_t[len._4_4_][_aflag->m_type].t_name);
        len._0_4_ = _aflag->m_type;
        cu = strlen((el->el_tty).t_t[len._4_4_][_aflag->m_type].t_name);
        st = cu;
      }
      if ((int)len == -1) {
        s._7_1_ = '\0';
      }
      else {
        s._7_1_ = '\0';
        if (((el->el_tty).t_t[len._4_4_][(int)len].t_setmask & _aflag->m_value) != 0) {
          s._7_1_ = '+';
        }
        if (((el->el_tty).t_t[len._4_4_][(int)len].t_clrmask & _aflag->m_value) != 0) {
          s._7_1_ = '-';
        }
      }
      if ((s._7_1_ != '\0') || ((int)s != 0)) {
        sVar4 = strlen(_aflag->m_name);
        p = (wchar_t *)(sVar4 + (long)(int)(uint)(s._7_1_ != '\0') + 1);
        if (st + (long)p < (ulong)(long)(el->el_terminal).t_size.h) {
          st = (long)p + st;
        }
        else {
          fprintf((FILE *)el->el_outfile,"\n%*s",cu & 0xffffffff,"");
          st = cu + (long)p;
        }
        if (s._7_1_ == '\0') {
          fprintf((FILE *)el->el_outfile,"%s ",_aflag->m_name);
        }
        else {
          fprintf((FILE *)el->el_outfile,"%c%s ",(ulong)(uint)(int)s._7_1_,_aflag->m_name);
        }
      }
    }
    fprintf((FILE *)el->el_outfile,"\n");
    return L'\0';
  }
  do {
    bVar6 = false;
    if (m != (ttymodes_t *)0x0) {
      d = (wchar_t *)m->m_name;
      bVar6 = d != (wchar_t *)0x0;
      m = (ttymodes_t *)&m->m_value;
    }
    if (!bVar6) {
      tty_setup_flags(el,_i,len._4_4_);
      if (((uint)(el->el_tty).t_mode == len._4_4_) &&
         (wVar2 = tty_setty(el,L'\x01',_i), wVar2 == L'\xffffffff')) {
        return L'\xffffffff';
      }
      return L'\0';
    }
    if ((*d == L'+') || (*d == L'-')) {
      s._7_1_ = (char)*d;
      d = d + 1;
    }
    else {
      s._7_1_ = '\0';
    }
    name._1016_8_ = d;
    _v = wcschr(d,L'=');
    for (_aflag = ttymodes; _aflag->m_name != (char *)0x0; _aflag = _aflag + 1) {
      if (_v == (wchar_t *)0x0) {
        pcVar3 = _aflag->m_name;
        pcVar5 = ct_encode_string((wchar_t *)name._1016_8_,&el->el_scratch);
        local_4a4 = strcmp(pcVar3,pcVar5);
      }
      else {
        pcVar3 = _aflag->m_name;
        pcVar5 = ct_encode_string((wchar_t *)name._1016_8_,&el->el_scratch);
        local_4a4 = strncmp(pcVar3,pcVar5,(long)_v - name._1016_8_ >> 2);
      }
      if ((local_4a4 == 0) && ((_v == (wchar_t *)0x0 || (_aflag->m_type == 4)))) break;
    }
    if (_aflag->m_name == (char *)0x0) {
      fprintf((FILE *)el->el_errfile,"%s: Invalid argument `%ls\'.\n",&tios,name._1016_8_);
      return L'\xffffffff';
    }
    if (_v == (wchar_t *)0x0) {
      if (s._7_1_ == '+') {
        (el->el_tty).t_t[len._4_4_][_aflag->m_type].t_setmask =
             _aflag->m_value | (el->el_tty).t_t[len._4_4_][_aflag->m_type].t_setmask;
        (el->el_tty).t_t[len._4_4_][_aflag->m_type].t_clrmask =
             (_aflag->m_value ^ 0xffffffff) & (el->el_tty).t_t[len._4_4_][_aflag->m_type].t_clrmask;
      }
      else if (s._7_1_ == '-') {
        (el->el_tty).t_t[len._4_4_][_aflag->m_type].t_setmask =
             (_aflag->m_value ^ 0xffffffff) & (el->el_tty).t_t[len._4_4_][_aflag->m_type].t_setmask;
        (el->el_tty).t_t[len._4_4_][_aflag->m_type].t_clrmask =
             _aflag->m_value | (el->el_tty).t_t[len._4_4_][_aflag->m_type].t_clrmask;
      }
      else {
        (el->el_tty).t_t[len._4_4_][_aflag->m_type].t_setmask =
             (_aflag->m_value ^ 0xffffffff) & (el->el_tty).t_t[len._4_4_][_aflag->m_type].t_setmask;
        (el->el_tty).t_t[len._4_4_][_aflag->m_type].t_clrmask =
             (_aflag->m_value ^ 0xffffffff) & (el->el_tty).t_t[len._4_4_][_aflag->m_type].t_clrmask;
      }
    }
    else {
      iVar1 = ffs(_aflag->m_value);
      if (_v[1] == L'\0') {
        local_4bc = (el->el_tty).t_vdisable;
        _v = _v + 1;
      }
      else {
        _v = _v + 1;
        wVar2 = parse__escape((wchar_t **)&v);
        local_4bc = (uchar)wVar2;
      }
      if (iVar1 == 0) {
        __assert_fail("c != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ksherlock[P]libedit/src/tty.c"
                      ,0x4f7,"int tty_stty(EditLine *, int, const wchar_t **)");
      }
      wVar2 = tty__getcharindex(iVar1 + L'\xffffffff');
      if (wVar2 == L'\xffffffff') {
        __assert_fail("c != -1",
                      "/workspace/llm4binary/github/license_c_cmakelists/ksherlock[P]libedit/src/tty.c"
                      ,0x4fa,"int tty_stty(EditLine *, int, const wchar_t **)");
      }
      _i->c_cc[wVar2] = local_4bc;
    }
  } while( true );
}

Assistant:

libedit_private int
/*ARGSUSED*/
tty_stty(EditLine *el, int argc __attribute__((__unused__)),
    const wchar_t **argv)
{
	const ttymodes_t *m;
	char x;
	int aflag = 0;
	const wchar_t *s, *d;
        char name[EL_BUFSIZ];
	struct termios *tios = &el->el_tty.t_ex;
	int z = EX_IO;

	if (argv == NULL)
		return -1;
	strlcpy(name, ct_encode_string(*argv++, &el->el_scratch), sizeof(name));

	while (argv && *argv && argv[0][0] == '-' && argv[0][2] == '\0')
		switch (argv[0][1]) {
		case 'a':
			aflag++;
			argv++;
			break;
		case 'd':
			argv++;
			tios = &el->el_tty.t_ed;
			z = ED_IO;
			break;
		case 'x':
			argv++;
			tios = &el->el_tty.t_ex;
			z = EX_IO;
			break;
		case 'q':
			argv++;
			tios = &el->el_tty.t_ts;
			z = QU_IO;
			break;
		default:
			(void) fprintf(el->el_errfile,
			    "%s: Unknown switch `%lc'.\n",
			    name, (wint_t)argv[0][1]);
			return -1;
		}

	if (!argv || !*argv) {
		int i = -1;
		size_t len = 0, st = 0, cu;
		for (m = ttymodes; m->m_name; m++) {
			if (m->m_type != i) {
				(void) fprintf(el->el_outfile, "%s%s",
				    i != -1 ? "\n" : "",
				    el->el_tty.t_t[z][m->m_type].t_name);
				i = m->m_type;
				st = len =
				    strlen(el->el_tty.t_t[z][m->m_type].t_name);
			}
			if (i != -1) {
			    x = (el->el_tty.t_t[z][i].t_setmask & m->m_value)
				?  '+' : '\0';

			    if (el->el_tty.t_t[z][i].t_clrmask & m->m_value)
				x = '-';
			} else {
			    x = '\0';
			}

			if (x != '\0' || aflag) {

				cu = strlen(m->m_name) + (x != '\0') + 1;

				if (len + cu >=
				    (size_t)el->el_terminal.t_size.h) {
					(void) fprintf(el->el_outfile, "\n%*s",
					    (int)st, "");
					len = st + cu;
				} else
					len += cu;

				if (x != '\0')
					(void) fprintf(el->el_outfile, "%c%s ",
					    x, m->m_name);
				else
					(void) fprintf(el->el_outfile, "%s ",
					    m->m_name);
			}
		}
		(void) fprintf(el->el_outfile, "\n");
		return 0;
	}
	while (argv && (s = *argv++)) {
		const wchar_t *p;
		switch (*s) {
		case '+':
		case '-':
			x = (char)*s++;
			break;
		default:
			x = '\0';
			break;
		}
		d = s;
		p = wcschr(s, L'=');
		for (m = ttymodes; m->m_name; m++)
			if ((p ? strncmp(m->m_name, ct_encode_string(d,
			    &el->el_scratch), (size_t)(p - d)) :
			    strcmp(m->m_name, ct_encode_string(d,
			    &el->el_scratch))) == 0 &&
			    (p == NULL || m->m_type == MD_CHAR))
				break;

		if (!m->m_name) {
			(void) fprintf(el->el_errfile,
			    "%s: Invalid argument `%ls'.\n", name, d);
			return -1;
		}
		if (p) {
			int c = ffs((int)m->m_value);
			int v = *++p ? parse__escape(&p) :
			    el->el_tty.t_vdisable;
			assert(c != 0);
			c--;
			c = tty__getcharindex(c);
			assert(c != -1);
			tios->c_cc[c] = (cc_t)v;
			continue;
		}
		switch (x) {
		case '+':
			el->el_tty.t_t[z][m->m_type].t_setmask |= m->m_value;
			el->el_tty.t_t[z][m->m_type].t_clrmask &= ~m->m_value;
			break;
		case '-':
			el->el_tty.t_t[z][m->m_type].t_setmask &= ~m->m_value;
			el->el_tty.t_t[z][m->m_type].t_clrmask |= m->m_value;
			break;
		default:
			el->el_tty.t_t[z][m->m_type].t_setmask &= ~m->m_value;
			el->el_tty.t_t[z][m->m_type].t_clrmask &= ~m->m_value;
			break;
		}
	}

	tty_setup_flags(el, tios, z);
	if (el->el_tty.t_mode == z) {
		if (tty_setty(el, TCSADRAIN, tios) == -1) {
#ifdef DEBUG_TTY
			(void) fprintf(el->el_errfile, "%s: tty_setty: %s\n",
			    __func__, strerror(errno));
#endif /* DEBUG_TTY */
			return -1;
		}
	}

	return 0;
}